

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

attr_list attr_add_list(attr_list list1,attr_list list2)

{
  attr_list *pp_Var1;
  attr_list in_RSI;
  attr_list in_RDI;
  attr_list in_stack_fffffffffffffff8;
  
  init_global_atom_server((atom_server *)0x104dc9);
  if (in_RDI->list_of_lists == 0) {
    in_RDI = attr_join_lists(in_stack_fffffffffffffff8,in_RDI);
  }
  else {
    pp_Var1 = (attr_list *)
              realloc((in_RDI->l).lists.lists,(long)((in_RDI->l).lists.sublist_count + 1) << 3);
    (in_RDI->l).lists.lists = pp_Var1;
    (in_RDI->l).lists.lists[(in_RDI->l).lists.sublist_count] = in_RSI;
    in_RSI->ref_count = in_RSI->ref_count + 1;
    (in_RDI->l).lists.sublist_count = (in_RDI->l).lists.sublist_count + 1;
  }
  return in_RDI;
}

Assistant:

extern attr_list
attr_add_list(attr_list list1, attr_list list2)
{
    init_global_atom_server(&global_as);
    if (list1->list_of_lists == 0) {
        return attr_join_lists(list1, list2);
    }
    list1->l.lists.lists =
           (attr_list *)realloc(list1->l.lists.lists, sizeof(attr_list) *
                                (list1->l.lists.sublist_count+1));
    list1->l.lists.lists[list1->l.lists.sublist_count] = list2;
    list2->ref_count++;
    list1->l.lists.sublist_count += 1;
    return list1;   
}